

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O1

bool __thiscall
MinVR::VRDataIndex::exists(VRDataIndex *this,string *key,string *nameSpace,bool inherit)

{
  pointer pcVar1;
  iterator iVar2;
  string local_48;
  
  pcVar1 = (nameSpace->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + nameSpace->_M_string_length);
  iVar2 = _getEntry(this,key,&local_48,inherit);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return (_Rb_tree_header *)iVar2._M_node != &(this->_theIndex)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool exists(const std::string &key,
              const std::string nameSpace = "",
              const bool inherit = true) const {
	  return const_cast<VRDataIndex*>(this)->_getEntry(key, nameSpace, inherit) != _theIndex.end();
  }